

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BtreeGetMeta(Btree *p,int idx,u32 *pMeta)

{
  undefined8 *puVar1;
  u32 uVar2;
  u32 *in_RDX;
  int in_ESI;
  long in_RDI;
  BtShared *pBt;
  
  puVar1 = *(undefined8 **)(in_RDI + 8);
  sqlite3BtreeEnter((Btree *)0x1857da);
  if (in_ESI == 0xf) {
    uVar2 = sqlite3PagerDataVersion((Pager *)*puVar1);
    *in_RDX = uVar2 + *(int *)(in_RDI + 0x1c);
  }
  else {
    uVar2 = sqlite3Get4byte((u8 *)(*(long *)(puVar1[3] + 0x50) + (long)(in_ESI * 4 + 0x24)));
    *in_RDX = uVar2;
  }
  sqlite3BtreeLeave((Btree *)0x185835);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BtreeGetMeta(Btree *p, int idx, u32 *pMeta){
  BtShared *pBt = p->pBt;

  sqlite3BtreeEnter(p);
  assert( p->inTrans>TRANS_NONE );
  assert( SQLITE_OK==querySharedCacheTableLock(p, SCHEMA_ROOT, READ_LOCK) );
  assert( pBt->pPage1 );
  assert( idx>=0 && idx<=15 );

  if( idx==BTREE_DATA_VERSION ){
    *pMeta = sqlite3PagerDataVersion(pBt->pPager) + p->iBDataVersion;
  }else{
    *pMeta = get4byte(&pBt->pPage1->aData[36 + idx*4]);
  }

  /* If auto-vacuum is disabled in this build and this is an auto-vacuum
  ** database, mark the database as read-only.  */
#ifdef SQLITE_OMIT_AUTOVACUUM
  if( idx==BTREE_LARGEST_ROOT_PAGE && *pMeta>0 ){
    pBt->btsFlags |= BTS_READ_ONLY;
  }
#endif

  sqlite3BtreeLeave(p);
}